

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_parse_dns(char *buf,int len,mg_dns_message *msg)

{
  uchar *data;
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  mg_dns_resource_record *pmVar4;
  int iVar5;
  
  (msg->pkt).p = buf;
  (msg->pkt).len = (long)len;
  if (len < 0xc) {
    iVar5 = -1;
  }
  else {
    data = (uchar *)(buf + 0xc);
    msg->transaction_id = *(uint16_t *)buf;
    msg->flags = *(ushort *)(buf + 2) << 8 | *(ushort *)(buf + 2) >> 8;
    uVar1 = *(ushort *)(buf + 4) << 8 | *(ushort *)(buf + 4) >> 8;
    uVar2 = (uint)uVar1;
    msg->num_questions = (uint)uVar1;
    msg->num_answers = (uint)(ushort)(*(ushort *)(buf + 6) << 8 | *(ushort *)(buf + 6) >> 8);
    pmVar4 = msg->questions;
    for (uVar3 = 0; (uVar3 < 0x20 && ((long)uVar3 < (long)(int)uVar2)); uVar3 = uVar3 + 1) {
      data = mg_parse_dns_resource_record(data,(uchar *)(buf + len),pmVar4,0);
      uVar2 = msg->num_questions;
      pmVar4 = pmVar4 + 1;
    }
    pmVar4 = msg->answers;
    iVar5 = 0;
    for (uVar3 = 0; (uVar3 < 0x20 && ((long)uVar3 < (long)msg->num_answers)); uVar3 = uVar3 + 1) {
      data = mg_parse_dns_resource_record(data,(uchar *)(buf + len),pmVar4,1);
      pmVar4 = pmVar4 + 1;
    }
  }
  return iVar5;
}

Assistant:

int mg_parse_dns(const char *buf, int len, struct mg_dns_message *msg) {
    struct mg_dns_header *header = (struct mg_dns_header *) buf;
    unsigned char *data = (unsigned char *) buf + sizeof(*header);
    unsigned char *end = (unsigned char *) buf + len;
    int i;
    msg->pkt.p = buf;
    msg->pkt.len = len;

    if (len < (int) sizeof(*header)) {
        return -1; /* LCOV_EXCL_LINE */
    }

    msg->transaction_id = header->transaction_id;
    msg->flags = ntohs(header->flags);
    msg->num_questions = ntohs(header->num_questions);
    msg->num_answers = ntohs(header->num_answers);

    for (i = 0; i < msg->num_questions && i < (int) ARRAY_SIZE(msg->questions);
         i++) {
        data = mg_parse_dns_resource_record(data, end, &msg->questions[i], 0);
    }

    for (i = 0; i < msg->num_answers && i < (int) ARRAY_SIZE(msg->answers); i++) {
        data = mg_parse_dns_resource_record(data, end, &msg->answers[i], 1);
    }

    return 0;
}